

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O1

void __thiscall CppUnit::PlugInManager::unload(PlugInManager *this,string *libraryFileName)

{
  _Elt_pointer pPVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  _Map_pointer ppPVar4;
  _Elt_pointer plugIn;
  _Elt_pointer pPVar5;
  iterator local_80;
  iterator local_60;
  pointer local_40;
  PlugIns *local_38;
  
  plugIn = (this->m_plugIns).
           super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pPVar1 = (this->m_plugIns).
           super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (plugIn != pPVar1) {
    local_38 = &this->m_plugIns;
    pPVar5 = (this->m_plugIns).
             super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppPVar4 = (this->m_plugIns).
              super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_40 = (libraryFileName->_M_dataplus)._M_p;
    sVar2 = libraryFileName->_M_string_length;
    do {
      __n = (plugIn->m_fileName)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
LAB_00125803:
          unload(this,plugIn);
          local_80._M_first = *ppPVar4;
          local_80._M_last = local_80._M_first + 10;
          local_80._M_cur = plugIn;
          local_80._M_node = ppPVar4;
          std::
          deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
          ::_M_erase(&local_60,local_38,&local_80);
          return;
        }
        this = (PlugInManager *)(plugIn->m_fileName)._M_dataplus._M_p;
        iVar3 = bcmp(this,local_40,__n);
        if (iVar3 == 0) goto LAB_00125803;
      }
      plugIn = plugIn + 1;
      if (plugIn == pPVar5) {
        plugIn = ppPVar4[1];
        ppPVar4 = ppPVar4 + 1;
        pPVar5 = plugIn + 10;
      }
    } while (plugIn != pPVar1);
  }
  return;
}

Assistant:

void 
PlugInManager::unload( const std::string &libraryFileName )
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
  {
    if ( (*it).m_fileName == libraryFileName )
    {
      unload( *it );
      m_plugIns.erase( it );
      break;
    }
  }
}